

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

uint8_t EBML_CodedValueLength
                  (filepos_t Length,size_t CodedSize,uint8_t *OutBuffer,bool_t bSizeIsFinite)

{
  ulong local_38;
  size_t i;
  int _SizeMask;
  bool_t bSizeIsFinite_local;
  uint8_t *OutBuffer_local;
  size_t CodedSize_local;
  filepos_t Length_local;
  
  i._4_4_ = 0xff;
  CodedSize_local = Length;
  if (bSizeIsFinite == 0) {
    CodedSize_local = 0x7fffffffffffffff;
  }
  *OutBuffer = (uint8_t)(1 << (8 - (uint8_t)CodedSize & 0x1f));
  for (local_38 = 1; local_38 < CodedSize; local_38 = local_38 + 1) {
    OutBuffer[CodedSize - local_38] = (byte)CodedSize_local;
    CodedSize_local = (long)CodedSize_local >> 8;
    i._4_4_ = i._4_4_ >> 1;
  }
  *OutBuffer = *OutBuffer | (byte)CodedSize_local & (byte)i._4_4_;
  return (uint8_t)CodedSize;
}

Assistant:

uint8_t EBML_CodedValueLength(filepos_t Length, size_t CodedSize, uint8_t *OutBuffer, bool_t bSizeIsFinite)
{
    int _SizeMask = 0xFF;
    size_t i;
#if 0
if (CodedSize==3)
printf("%08X ",(int)Length);
#endif
    if (!bSizeIsFinite)
        Length=MAX_FILEPOS;
    OutBuffer[0] = (uint8_t)(1 << (8 - CodedSize));
    for (i=1; i<CodedSize; ++i)
    {
        OutBuffer[CodedSize-i] = (uint8_t)(Length & 0xFF);
        Length >>= 8;
        _SizeMask >>= 1;
    }
    // first one use a OR with the "EBML size head"
    OutBuffer[0] |= Length & 0xFF & _SizeMask;
#if 0
if (CodedSize==3)
printf("%02X%02X%02X\n",OutBuffer[0],OutBuffer[1],OutBuffer[2]);
#endif
    return (uint8_t)CodedSize;
}